

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::NetworkUpdateParameters::SerializeWithCachedSizes
          (NetworkUpdateParameters *this,CodedOutputStream *output)

{
  int iVar1;
  Type *value;
  int index;
  
  iVar1 = (this->losslayers_).super_RepeatedPtrFieldBase.current_size_;
  for (index = 0; iVar1 != index; index = index + 1) {
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                      (&(this->losslayers_).super_RepeatedPtrFieldBase,index);
    google::protobuf::internal::WireFormatLite::WriteMessage(1,&value->super_MessageLite,output);
  }
  if (this != (NetworkUpdateParameters *)&_NetworkUpdateParameters_default_instance_ &&
      this->optimizer_ != (Optimizer *)0x0) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&this->optimizer_->super_MessageLite,output);
  }
  if (this->epochs_ != (Int64Parameter *)0x0 &&
      this != (NetworkUpdateParameters *)&_NetworkUpdateParameters_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (3,&this->epochs_->super_MessageLite,output);
  }
  if (this->shuffle_ != (BoolParameter *)0x0 &&
      this != (NetworkUpdateParameters *)&_NetworkUpdateParameters_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (10,&this->shuffle_->super_MessageLite,output);
  }
  if (this->seed_ != (Int64Parameter *)0x0 &&
      this != (NetworkUpdateParameters *)&_NetworkUpdateParameters_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (0x14,&this->seed_->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void NetworkUpdateParameters::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.NetworkUpdateParameters)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .CoreML.Specification.LossLayer lossLayers = 1;
  for (unsigned int i = 0, n = this->losslayers_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, this->losslayers(i), output);
  }

  // .CoreML.Specification.Optimizer optimizer = 2;
  if (this->has_optimizer()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *this->optimizer_, output);
  }

  // .CoreML.Specification.Int64Parameter epochs = 3;
  if (this->has_epochs()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      3, *this->epochs_, output);
  }

  // .CoreML.Specification.BoolParameter shuffle = 10;
  if (this->has_shuffle()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      10, *this->shuffle_, output);
  }

  // .CoreML.Specification.Int64Parameter seed = 20;
  if (this->has_seed()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      20, *this->seed_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.NetworkUpdateParameters)
}